

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvm.cpp
# Opt level: O0

Value * Kvm::peekCharProc(Kvm *vm,Value *args)

{
  char c;
  bool bVar1;
  Value *local_40;
  type local_38;
  int_type result;
  istream *stream;
  InputPort *ip;
  Value *args_local;
  Kvm *vm_local;
  
  if (args == vm->NIL) {
    local_38 = (type)&std::cin;
  }
  else {
    local_38 = std::
               unique_ptr<std::basic_ifstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
               ::operator*((unique_ptr<std::basic_ifstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                            *)(args + 1));
  }
  c = std::istream::peek();
  bVar1 = std::ios::operator_cast_to_bool((ios *)(local_38 + *(long *)(*(long *)local_38 + -0x18)));
  if (bVar1) {
    local_40 = makeChar(vm,c);
  }
  else {
    local_40 = vm->EOFOBJ;
  }
  return local_40;
}

Assistant:

const Value* Kvm::peekCharProc(Kvm *vm, const Value *args)
{
    const InputPort *ip = static_cast<const InputPort *>(args);
    std::istream &stream = args == vm->NIL ? std::cin : *ip->input;
    auto result = stream.peek();
    return stream ? vm->makeChar(result) : vm->EOFOBJ;
}